

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBlockReader.cpp
# Opt level: O0

void __thiscall IBlockReader::getWord(IBlockReader *this,string *str)

{
  char cVar1;
  int local_20;
  int num_3l;
  char tempChar;
  string *str_local;
  IBlockReader *this_local;
  
  cVar1 = std::istream::get();
  if (cVar1 == '{') {
    std::__cxx11::string::operator+=((string *)str,'{');
    this->m_hasChild = true;
    local_20 = 1;
    while (cVar1 = std::istream::get(), cVar1 != -1 && local_20 != 0) {
      std::__cxx11::string::operator+=((string *)str,cVar1);
      if (cVar1 == '\n') {
        std::__cxx11::string::operator+=((string *)str,'\n');
      }
      else if (cVar1 == '}') {
        local_20 = local_20 + -1;
      }
    }
  }
  return;
}

Assistant:

void IBlockReader::getWord(std::string &str) {
    char tempChar;
    int num_3l;

    tempChar=m_ifs->get();
    if(tempChar=='{')
    {
        str+=tempChar;
        m_hasChild= true;
        num_3l=1;

        while ((tempChar=m_ifs->get())!=EOF&&num_3l)
        {
            str+=tempChar;
            if(tempChar=='\n')
            {
                str+='\n';
            }
            else if(tempChar=='}')
                num_3l--;
        }
    }
}